

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O3

void __thiscall TileWire::followWire(TileWire *this,Direction direction,State state)

{
  char *pcVar1;
  uint uVar2;
  Direction DVar3;
  TileWire *pTVar4;
  long lVar5;
  pointer ppVar6;
  undefined1 *puVar7;
  pair<TileWire_*,_Direction> *wire;
  Vector2u *pVVar8;
  Board *pBVar9;
  Tile *pTVar10;
  _Elt_pointer ppVar11;
  Configuration *pCVar12;
  ostream *poVar13;
  _Elt_pointer ppVar14;
  pair<TileWire_*,_Direction> *wire_1;
  pointer ppVar15;
  FollowWireStage stage;
  FollowWireStage local_48;
  State local_44;
  Vector2u local_40;
  undefined1 *local_38;
  
  local_48 = INITIAL_STAGE;
  local_44 = state;
  _addNextTile(this,&this->super_Tile,direction,&local_44,&local_48);
  if (wireNodes.c.
      super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      wireNodes.c.
      super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
    ::pop_back(&wireNodes.c);
    pcVar1 = &(&this->super_Tile)[(long)(int)(this->super_Tile)._direction * 2].field_0x21 +
             (long)(int)direction * 4 + (long)(int)this->_type * 0x10;
    if ((*pcVar1 == '\x01') && (pVVar8 = Tile::getPosition(&this->super_Tile), pVVar8->y != 0)) {
      pBVar9 = Tile::getBoardPtr(&this->super_Tile);
      pVVar8 = Tile::getPosition(&this->super_Tile);
      uVar2 = pVVar8->x;
      pVVar8 = Tile::getPosition(&this->super_Tile);
      local_40.y = pVVar8->y - 1;
      local_40.x = uVar2;
      pTVar10 = Board::getTile(pBVar9,&local_40);
      _addNextTile(this,pTVar10,NORTH,&local_44,&local_48);
    }
    if (pcVar1[1] == '\x01') {
      pVVar8 = Tile::getPosition(&this->super_Tile);
      uVar2 = pVVar8->x;
      pBVar9 = Tile::getBoardPtr(&this->super_Tile);
      pVVar8 = Board::getSize(pBVar9);
      if (uVar2 < pVVar8->x - 1) {
        pBVar9 = Tile::getBoardPtr(&this->super_Tile);
        pVVar8 = Tile::getPosition(&this->super_Tile);
        uVar2 = pVVar8->x;
        pVVar8 = Tile::getPosition(&this->super_Tile);
        local_40.y = pVVar8->y;
        local_40.x = uVar2 + 1;
        pTVar10 = Board::getTile(pBVar9,&local_40);
        _addNextTile(this,pTVar10,EAST,&local_44,&local_48);
      }
    }
    if (pcVar1[2] == '\x01') {
      pVVar8 = Tile::getPosition(&this->super_Tile);
      uVar2 = pVVar8->y;
      pBVar9 = Tile::getBoardPtr(&this->super_Tile);
      pVVar8 = Board::getSize(pBVar9);
      if (uVar2 < pVVar8->y - 1) {
        pBVar9 = Tile::getBoardPtr(&this->super_Tile);
        pVVar8 = Tile::getPosition(&this->super_Tile);
        uVar2 = pVVar8->x;
        pVVar8 = Tile::getPosition(&this->super_Tile);
        local_40.y = pVVar8->y + 1;
        local_40.x = uVar2;
        pTVar10 = Board::getTile(pBVar9,&local_40);
        _addNextTile(this,pTVar10,SOUTH,&local_44,&local_48);
      }
    }
    if ((pcVar1[3] == '\x01') && (pVVar8 = Tile::getPosition(&this->super_Tile), pVVar8->x != 0)) {
      pBVar9 = Tile::getBoardPtr(&this->super_Tile);
      pVVar8 = Tile::getPosition(&this->super_Tile);
      uVar2 = pVVar8->x;
      pVVar8 = Tile::getPosition(&this->super_Tile);
      local_40.y = pVVar8->y;
      local_40.x = uVar2 - 1;
      pTVar10 = Board::getTile(pBVar9,&local_40);
      _addNextTile(this,pTVar10,WEST,&local_44,&local_48);
    }
    if (wireNodes.c.
        super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        wireNodes.c.
        super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_38 = &(this->super_Tile).field_0x21;
      do {
        if (wireNodes.c.
            super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            wireNodes.c.
            super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar14 = wireNodes.c.
                    super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x1f;
          ppVar11 = wireNodes.c.
                    super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        else {
          ppVar14 = wireNodes.c.
                    super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          ppVar11 = wireNodes.c.
                    super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        }
        pTVar4 = ppVar14->first;
        DVar3 = ppVar11[-1].second;
        std::
        deque<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
        ::pop_back(&wireNodes.c);
        puVar7 = local_38;
        lVar5 = (long)(int)(pTVar4->super_Tile)._direction * 0x50 +
                (long)(int)*(Type *)(&pTVar4->field_0x140 + 0x24) * 0x10;
        if (((local_38[(long)(int)DVar3 * 4 + lVar5] == '\x01') && (DVar3 != SOUTH)) &&
           (pVVar8 = Tile::getPosition(&pTVar4->super_Tile), pVVar8->y != 0)) {
          pBVar9 = Tile::getBoardPtr(&this->super_Tile);
          pVVar8 = Tile::getPosition(&pTVar4->super_Tile);
          uVar2 = pVVar8->x;
          pVVar8 = Tile::getPosition(&pTVar4->super_Tile);
          local_40.y = pVVar8->y - 1;
          local_40.x = uVar2;
          pTVar10 = Board::getTile(pBVar9,&local_40);
          _addNextTile(this,pTVar10,NORTH,&local_44,&local_48);
        }
        lVar5 = (long)(int)DVar3 * 4 + lVar5;
        if ((puVar7[lVar5 + 1] == '\x01') && (DVar3 != WEST)) {
          pVVar8 = Tile::getPosition(&pTVar4->super_Tile);
          uVar2 = pVVar8->x;
          pBVar9 = Tile::getBoardPtr(&this->super_Tile);
          pVVar8 = Board::getSize(pBVar9);
          if (uVar2 < pVVar8->x - 1) {
            pBVar9 = Tile::getBoardPtr(&this->super_Tile);
            pVVar8 = Tile::getPosition(&pTVar4->super_Tile);
            uVar2 = pVVar8->x;
            pVVar8 = Tile::getPosition(&pTVar4->super_Tile);
            local_40.y = pVVar8->y;
            local_40.x = uVar2 + 1;
            pTVar10 = Board::getTile(pBVar9,&local_40);
            _addNextTile(this,pTVar10,EAST,&local_44,&local_48);
          }
        }
        if ((puVar7[lVar5 + 2] == '\x01') && (DVar3 != NORTH)) {
          pVVar8 = Tile::getPosition(&pTVar4->super_Tile);
          uVar2 = pVVar8->y;
          pBVar9 = Tile::getBoardPtr(&this->super_Tile);
          pVVar8 = Board::getSize(pBVar9);
          if (uVar2 < pVVar8->y - 1) {
            pBVar9 = Tile::getBoardPtr(&this->super_Tile);
            pVVar8 = Tile::getPosition(&pTVar4->super_Tile);
            uVar2 = pVVar8->x;
            pVVar8 = Tile::getPosition(&pTVar4->super_Tile);
            local_40.y = pVVar8->y + 1;
            local_40.x = uVar2;
            pTVar10 = Board::getTile(pBVar9,&local_40);
            _addNextTile(this,pTVar10,SOUTH,&local_44,&local_48);
          }
        }
        if (((puVar7[lVar5 + 3] == '\x01') && (DVar3 != EAST)) &&
           (pVVar8 = Tile::getPosition(&pTVar4->super_Tile), pVVar8->x != 0)) {
          pBVar9 = Tile::getBoardPtr(&this->super_Tile);
          pVVar8 = Tile::getPosition(&pTVar4->super_Tile);
          uVar2 = pVVar8->x;
          pVVar8 = Tile::getPosition(&pTVar4->super_Tile);
          local_40.y = pVVar8->y;
          local_40.x = uVar2 - 1;
          pTVar10 = Board::getTile(pBVar9,&local_40);
          _addNextTile(this,pTVar10,WEST,&local_44,&local_48);
        }
      } while (wireNodes.c.
               super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               wireNodes.c.
               super__Deque_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    ppVar15 = traversedWires.
              super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppVar6 = traversedWires.
             super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_48 == INVALID_STAGE) {
      for (; ppVar6 != ppVar15; ppVar6 = ppVar6 + 1) {
        pTVar4 = ppVar6->first;
        if ((pTVar4->_type == CROSSOVER) && ((ppVar6->second & 0x80000001) == EAST)) {
          pTVar4->_state2 = MIDDLE;
        }
        else {
          pTVar4->_state1 = MIDDLE;
        }
      }
      pCVar12 = Simulator::getConfig();
      if (pCVar12->pauseOnConflict == true) {
        if (Board::numStateErrors < 10) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Detected state conflict in wire at position (",0x2d);
          Tile::getPosition(&this->super_Tile);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
          Tile::getPosition(&this->super_Tile);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,").",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
        }
        ppVar6 = traversedWires.
                 super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        Board::numStateErrors = Board::numStateErrors + 1;
        for (ppVar15 = traversedWires.
                       super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar6;
            ppVar15 = ppVar15 + 1) {
          Tile::setHighlight(&ppVar15->first->super_Tile,true);
        }
      }
    }
    if (traversedWires.
        super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        traversedWires.
        super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      traversedWires.
      super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           traversedWires.
           super__Vector_base<std::pair<TileWire_*,_Direction>,_std::allocator<std::pair<TileWire_*,_Direction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  return;
}

Assistant:

void TileWire::followWire(Direction direction, State state) {
    assert(traversedWires.empty());
    assert(wireNodes.empty());
    
    //cout << "Follow wire started at (" << getPosition().x << ", " << getPosition().y << ")." << endl;
    
    FollowWireStage stage = INITIAL_STAGE;
    _addNextTile(this, direction, state, stage);    // Add the first wire to the traversal. If it did not connect or was already checked then we return, otherwise continue traversal.
    if (wireNodes.empty()) {
        return;
    }
    wireNodes.pop();
    
    const bool* exitDirections = CONNECTION_INFO[_direction][_type][direction];    // Check for connection with all adjacent tiles (in the case that this is some arbitrary wire chosen and did not come from a source gate).
    if (exitDirections[0] && getPosition().y > 0) {
        _addNextTile(getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y - 1)), NORTH, state, stage);
    }
    if (exitDirections[1] && getPosition().x < getBoardPtr()->getSize().x - 1) {
        _addNextTile(getBoardPtr()->getTile(Vector2u(getPosition().x + 1, getPosition().y)), EAST, state, stage);
    }
    if (exitDirections[2] && getPosition().y < getBoardPtr()->getSize().y - 1) {
        _addNextTile(getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y + 1)), SOUTH, state, stage);
    }
    if (exitDirections[3] && getPosition().x > 0) {
        _addNextTile(getBoardPtr()->getTile(Vector2u(getPosition().x - 1, getPosition().y)), WEST, state, stage);
    }
    
    while (!wireNodes.empty()) {    // Perform depth-first traversal on remaining connected wires.
        TileWire* currentWire = wireNodes.top().first;
        Direction currentDirection = wireNodes.top().second;
        wireNodes.pop();
        //cout << "  currently at (" << currentWire->getPosition().x << ", " << currentWire->getPosition().y << ") going direction " << currentDirection << endl;
        
        const bool* exitDirections = CONNECTION_INFO[currentWire->_direction][currentWire->_type][currentDirection];    // Check for connection with adjacent tiles that do not point back to source wire.
        if (exitDirections[0] && currentDirection != SOUTH && currentWire->getPosition().y > 0) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentWire->getPosition().x, currentWire->getPosition().y - 1)), NORTH, state, stage);
        }
        if (exitDirections[1] && currentDirection != WEST && currentWire->getPosition().x < getBoardPtr()->getSize().x - 1) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentWire->getPosition().x + 1, currentWire->getPosition().y)), EAST, state, stage);
        }
        if (exitDirections[2] && currentDirection != NORTH && currentWire->getPosition().y < getBoardPtr()->getSize().y - 1) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentWire->getPosition().x, currentWire->getPosition().y + 1)), SOUTH, state, stage);
        }
        if (exitDirections[3] && currentDirection != EAST && currentWire->getPosition().x > 0) {
            _addNextTile(getBoardPtr()->getTile(Vector2u(currentWire->getPosition().x - 1, currentWire->getPosition().y)), WEST, state, stage);
        }
    }
    
    if (stage == INVALID_STAGE) {    // Check if wire is in an invalid state and change it if so.
        _fixTraversedWires(MIDDLE);
        if (Simulator::getConfig().pauseOnConflict) {
            if (Board::numStateErrors < 10) {
                cout << "Detected state conflict in wire at position (" << getPosition().x << ", " << getPosition().y << ")." << endl;
            }
            ++Board::numStateErrors;
            for (pair<TileWire*, Direction>& wire : traversedWires) {
                wire.first->setHighlight(true);
            }
        }
    }
    traversedWires.clear();
}